

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::Merge(MergeForm4 merge,Image *in1,Image *in2,Image *in3)

{
  undefined8 in_RCX;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  Image *out;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  uint8_t in_stack_ffffffffffffff5e;
  uint8_t in_stack_ffffffffffffff5f;
  uint32_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff68;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,
                               CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))),
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff5f,in_stack_ffffffffffffff5e);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
  (*in_RSI)(in_RDX,0,0,in_RCX,0);
  return in_RDI;
}

Assistant:

Image Merge( FunctionTable::MergeForm4 merge,
                 const Image & in1, const Image & in2, const Image & in3 )
    {
        Image_Function::ParameterValidation( in1, in2, in3 );

        Image out = in1.generate( in1.width(), in1.height(), RGB );

        merge( in1, 0, 0, in2, 0, 0, in3, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }